

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

PaError PaUtil_InitializeBufferProcessor
                  (PaUtilBufferProcessor *bp,int inputChannelCount,
                  PaSampleFormat userInputSampleFormat,PaSampleFormat hostInputSampleFormat,
                  int outputChannelCount,PaSampleFormat userOutputSampleFormat,
                  PaSampleFormat hostOutputSampleFormat,double sampleRate,PaStreamFlags streamFlags,
                  unsigned_long framesPerUserBuffer,unsigned_long framesPerHostBuffer,
                  PaUtilHostBufferSizeMode hostBufferSizeMode,PaStreamCallback *streamCallback,
                  void *userData)

{
  uint uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  PaUtilConverter *pPVar4;
  PaUtilZeroer *pPVar5;
  void *pvVar6;
  void **ppvVar7;
  PaUtilChannelDescriptor *pPVar8;
  ulong uVar9;
  size_t sVar10;
  
  if ((streamFlags & 4) != 0) {
    if (framesPerUserBuffer != 0) {
      return -0x270b;
    }
    if (outputChannelCount < 1) {
      return -0x270b;
    }
    if (inputChannelCount < 1) {
      return -0x270b;
    }
    if (streamCallback == (PaStreamCallback *)0x0) {
      return -0x270b;
    }
  }
  bp->tempInputBuffer = (void *)0x0;
  bp->tempInputBufferPtrs = (void **)0x0;
  bp->tempOutputBuffer = (void *)0x0;
  bp->tempOutputBufferPtrs = (void **)0x0;
  bp->framesPerUserBuffer = framesPerUserBuffer;
  bp->framesPerHostBuffer = framesPerHostBuffer;
  bp->inputChannelCount = inputChannelCount;
  bp->outputChannelCount = outputChannelCount;
  bp->hostBufferSizeMode = hostBufferSizeMode;
  bp->hostInputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  bp->hostInputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  if (framesPerUserBuffer == 0) {
    bp->useNonAdaptingProcess = 1;
    bp->initialFramesInTempInputBuffer = 0;
    bp->initialFramesInTempOutputBuffer = 0;
    if (hostBufferSizeMode < paUtilUnknownHostBufferSize) {
      bp->framesPerTempBuffer = framesPerHostBuffer;
    }
    else {
      bp->framesPerTempBuffer = 0x400;
    }
  }
  else {
    bp->framesPerTempBuffer = framesPerUserBuffer;
    if ((hostBufferSizeMode == paUtilFixedHostBufferSize) &&
       (framesPerHostBuffer % framesPerUserBuffer == 0)) {
      bp->useNonAdaptingProcess = 1;
    }
    else {
      bp->useNonAdaptingProcess = 0;
      if (0 < outputChannelCount && 0 < inputChannelCount) {
        if (hostBufferSizeMode == paUtilFixedHostBufferSize) {
          if (framesPerHostBuffer == 0) {
            __assert_fail("M > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                          ,0x4f,"unsigned long CalculateFrameShift(unsigned long, unsigned long)");
          }
          uVar2 = GCD(framesPerHostBuffer,framesPerUserBuffer);
          uVar9 = 0;
          uVar3 = (framesPerHostBuffer * framesPerUserBuffer) / uVar2;
          if (framesPerHostBuffer < uVar3) {
            uVar9 = 0;
            uVar2 = framesPerHostBuffer;
            do {
              if (uVar9 <= uVar2 % framesPerUserBuffer) {
                uVar9 = uVar2 % framesPerUserBuffer;
              }
              uVar2 = uVar2 + framesPerHostBuffer;
            } while (uVar2 < uVar3);
          }
          if (framesPerHostBuffer < framesPerUserBuffer) {
            bp->initialFramesInTempInputBuffer = uVar9;
            bp->initialFramesInTempOutputBuffer = 0;
          }
          else {
            bp->initialFramesInTempInputBuffer = 0;
            bp->initialFramesInTempOutputBuffer = uVar9;
          }
        }
        else {
          bp->initialFramesInTempInputBuffer = 0;
          bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
        }
        goto LAB_00111d36;
      }
    }
    bp->initialFramesInTempInputBuffer = 0;
    bp->initialFramesInTempOutputBuffer = 0;
  }
LAB_00111d36:
  bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
  bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;
  if (0 < inputChannelCount) {
    uVar1 = Pa_GetSampleSize(hostInputSampleFormat);
    if ((int)uVar1 < 1) goto LAB_0011200f;
    bp->bytesPerHostInputSample = uVar1;
    uVar1 = Pa_GetSampleSize(userInputSampleFormat);
    if ((int)uVar1 < 1) goto LAB_0011200f;
    uVar9 = streamFlags | 2;
    if ((streamFlags & 2) != 0) {
      uVar9 = streamFlags;
    }
    if ((hostInputSampleFormat & 2) == 0) {
      uVar9 = streamFlags;
    }
    bp->bytesPerUserInputSample = uVar1;
    if ((userInputSampleFormat & 4) == 0) {
      uVar9 = streamFlags;
    }
    pPVar4 = PaUtil_SelectConverter(hostInputSampleFormat,userInputSampleFormat,uVar9);
    bp->inputConverter = pPVar4;
    pPVar5 = PaUtil_SelectZeroer(userInputSampleFormat);
    bp->inputZeroer = pPVar5;
    bp->userInputIsInterleaved = ~(uint)userInputSampleFormat >> 0x1f;
    bp->hostInputIsInterleaved = ~(uint)hostInputSampleFormat >> 0x1f;
    bp->userInputSampleFormatIsEqualToHost =
         (uint)(((hostInputSampleFormat ^ userInputSampleFormat) & 0xffffffff7fffffff) == 0);
    uVar9 = (ulong)(uint)inputChannelCount;
    sVar10 = bp->framesPerTempBuffer * uVar9 * (ulong)bp->bytesPerUserInputSample;
    pvVar6 = PaUtil_AllocateMemory(sVar10);
    bp->tempInputBuffer = pvVar6;
    uVar1 = 0xffffd8f8;
    if (pvVar6 == (void *)0x0) goto LAB_0011200f;
    if (bp->framesInTempInputBuffer != 0) {
      memset(pvVar6,0,sVar10);
    }
    if ((int)(uint)userInputSampleFormat < 0) {
      ppvVar7 = (void **)PaUtil_AllocateMemory(uVar9 * 8);
      bp->tempInputBufferPtrs = ppvVar7;
      if (ppvVar7 == (void **)0x0) goto LAB_0011200f;
    }
    pPVar8 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory(uVar9 << 5);
    bp->hostInputChannels[0] = pPVar8;
    if (pPVar8 == (PaUtilChannelDescriptor *)0x0) goto LAB_0011200f;
    bp->hostInputChannels[1] = pPVar8 + uVar9;
  }
  if (outputChannelCount < 1) {
LAB_00111fc0:
    PaUtil_InitializeTriangularDitherState(&bp->ditherGenerator);
    bp->samplePeriod = 1.0 / sampleRate;
    bp->streamCallback = streamCallback;
    bp->userData = userData;
    return 0;
  }
  uVar1 = Pa_GetSampleSize(hostOutputSampleFormat);
  if (0 < (int)uVar1) {
    bp->bytesPerHostOutputSample = uVar1;
    uVar1 = Pa_GetSampleSize(userOutputSampleFormat);
    if (0 < (int)uVar1) {
      bp->bytesPerUserOutputSample = uVar1;
      pPVar4 = PaUtil_SelectConverter(userOutputSampleFormat,hostOutputSampleFormat,streamFlags);
      bp->outputConverter = pPVar4;
      pPVar5 = PaUtil_SelectZeroer(hostOutputSampleFormat);
      bp->outputZeroer = pPVar5;
      bp->userOutputIsInterleaved = ~(uint)userOutputSampleFormat >> 0x1f;
      bp->hostOutputIsInterleaved = ~(uint)hostOutputSampleFormat >> 0x1f;
      bp->userOutputSampleFormatIsEqualToHost =
           (uint)(((hostOutputSampleFormat ^ userOutputSampleFormat) & 0xffffffff7fffffff) == 0);
      uVar9 = (ulong)(uint)outputChannelCount;
      sVar10 = bp->framesPerTempBuffer * uVar9 * (ulong)bp->bytesPerUserOutputSample;
      pvVar6 = PaUtil_AllocateMemory(sVar10);
      bp->tempOutputBuffer = pvVar6;
      uVar1 = 0xffffd8f8;
      if (pvVar6 != (void *)0x0) {
        if (bp->framesInTempOutputBuffer != 0) {
          memset(pvVar6,0,sVar10);
        }
        if ((int)(uint)userOutputSampleFormat < 0) {
          ppvVar7 = (void **)PaUtil_AllocateMemory(uVar9 * 8);
          bp->tempOutputBufferPtrs = ppvVar7;
          if (ppvVar7 == (void **)0x0) goto LAB_0011200f;
        }
        pPVar8 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory(uVar9 << 5);
        bp->hostOutputChannels[0] = pPVar8;
        if (pPVar8 != (PaUtilChannelDescriptor *)0x0) {
          bp->hostOutputChannels[1] = pPVar8 + uVar9;
          goto LAB_00111fc0;
        }
      }
    }
  }
LAB_0011200f:
  if (bp->tempInputBuffer != (void *)0x0) {
    PaUtil_FreeMemory(bp->tempInputBuffer);
  }
  if (bp->tempInputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory(bp->tempInputBufferPtrs);
  }
  pPVar8 = bp->hostInputChannels[0];
  if (pPVar8 != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory(pPVar8);
  }
  if (bp->tempOutputBuffer != (void *)0x0) {
    PaUtil_FreeMemory(bp->tempOutputBuffer);
  }
  if (bp->tempOutputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory(bp->tempOutputBufferPtrs);
  }
  pPVar8 = bp->hostOutputChannels[0];
  if (pPVar8 != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory(pPVar8);
  }
  return uVar1;
}

Assistant:

PaError PaUtil_InitializeBufferProcessor( PaUtilBufferProcessor* bp,
        int inputChannelCount, PaSampleFormat userInputSampleFormat,
        PaSampleFormat hostInputSampleFormat,
        int outputChannelCount, PaSampleFormat userOutputSampleFormat,
        PaSampleFormat hostOutputSampleFormat,
        double sampleRate,
        PaStreamFlags streamFlags,
        unsigned long framesPerUserBuffer,
        unsigned long framesPerHostBuffer,
        PaUtilHostBufferSizeMode hostBufferSizeMode,
        PaStreamCallback *streamCallback, void *userData )
{
    PaError result = paNoError;
    PaError bytesPerSample;
    unsigned long tempInputBufferSize, tempOutputBufferSize;
    PaStreamFlags tempInputStreamFlags;

    if( streamFlags & paNeverDropInput )
    {
        /* paNeverDropInput is only valid for full-duplex callback streams, with an unspecified number of frames per buffer. */
        if( !streamCallback || !(inputChannelCount > 0 && outputChannelCount > 0) ||
                framesPerUserBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    /* initialize buffer ptrs to zero so they can be freed if necessary in error */
    bp->tempInputBuffer = 0;
    bp->tempInputBufferPtrs = 0;
    bp->tempOutputBuffer = 0;
    bp->tempOutputBufferPtrs = 0;

    bp->framesPerUserBuffer = framesPerUserBuffer;
    bp->framesPerHostBuffer = framesPerHostBuffer;

    bp->inputChannelCount = inputChannelCount;
    bp->outputChannelCount = outputChannelCount;

    bp->hostBufferSizeMode = hostBufferSizeMode;

    bp->hostInputChannels[0] = bp->hostInputChannels[1] = 0;
    bp->hostOutputChannels[0] = bp->hostOutputChannels[1] = 0;

    if( framesPerUserBuffer == 0 ) /* streamCallback will accept any buffer size */
    {
        bp->useNonAdaptingProcess = 1;
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = 0;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                || hostBufferSizeMode == paUtilBoundedHostBufferSize )
        {
            bp->framesPerTempBuffer = framesPerHostBuffer;
        }
        else /* unknown host buffer size */
        {
             bp->framesPerTempBuffer = PA_FRAMES_PER_TEMP_BUFFER_WHEN_HOST_BUFFER_SIZE_IS_UNKNOWN_;
        }
    }
    else
    {
        bp->framesPerTempBuffer = framesPerUserBuffer;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                && framesPerHostBuffer % framesPerUserBuffer == 0 )
        {
            bp->useNonAdaptingProcess = 1;
            bp->initialFramesInTempInputBuffer = 0;
            bp->initialFramesInTempOutputBuffer = 0;
        }
        else
        {
            bp->useNonAdaptingProcess = 0;

            if( inputChannelCount > 0 && outputChannelCount > 0 )
            {
                /* full duplex */
                if( hostBufferSizeMode == paUtilFixedHostBufferSize )
                {
                    unsigned long frameShift =
                        CalculateFrameShift( framesPerHostBuffer, framesPerUserBuffer );

                    if( framesPerUserBuffer > framesPerHostBuffer )
                    {
                        bp->initialFramesInTempInputBuffer = frameShift;
                        bp->initialFramesInTempOutputBuffer = 0;
                    }
                    else
                    {
                        bp->initialFramesInTempInputBuffer = 0;
                        bp->initialFramesInTempOutputBuffer = frameShift;
                    }
                }
                else /* variable host buffer size, add framesPerUserBuffer latency */
                {
                    bp->initialFramesInTempInputBuffer = 0;
                    bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
                }
            }
            else
            {
                /* half duplex */
                bp->initialFramesInTempInputBuffer = 0;
                bp->initialFramesInTempOutputBuffer = 0;
            }
        }
    }


    bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
    bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;

    
    if( inputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        /* Under the assumption that no ADC in existence delivers better than 24bits resolution,
            we disable dithering when host input format is paInt32 and user format is paInt24, 
            since the host samples will just be padded with zeros anyway. */

        tempInputStreamFlags = streamFlags;
        if( !(tempInputStreamFlags & paDitherOff) /* dither is on */
                && (hostInputSampleFormat & paInt32) /* host input format is int32 */
                && (userInputSampleFormat & paInt24) /* user requested format is int24 */ ){

            tempInputStreamFlags = tempInputStreamFlags | paDitherOff;
        }

        bp->inputConverter =
            PaUtil_SelectConverter( hostInputSampleFormat, userInputSampleFormat, tempInputStreamFlags );

        bp->inputZeroer = PaUtil_SelectZeroer( userInputSampleFormat );
            
        bp->userInputIsInterleaved = (userInputSampleFormat & paNonInterleaved)?0:1;
		
        bp->hostInputIsInterleaved = (hostInputSampleFormat & paNonInterleaved)?0:1;

        bp->userInputSampleFormatIsEqualToHost = ((userInputSampleFormat & ~paNonInterleaved) == (hostInputSampleFormat & ~paNonInterleaved));

        tempInputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserInputSample * inputChannelCount;
         
        bp->tempInputBuffer = PaUtil_AllocateMemory( tempInputBufferSize );
        if( bp->tempInputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }
        
        if( bp->framesInTempInputBuffer > 0 )
            memset( bp->tempInputBuffer, 0, tempInputBufferSize );

        if( userInputSampleFormat & paNonInterleaved )
        {
            bp->tempInputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*inputChannelCount );
            if( bp->tempInputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostInputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor) * inputChannelCount * 2);
        if( bp->hostInputChannels[0] == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostInputChannels[1] = &bp->hostInputChannels[0][inputChannelCount];
    }

    if( outputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bp->outputConverter =
            PaUtil_SelectConverter( userOutputSampleFormat, hostOutputSampleFormat, streamFlags );

        bp->outputZeroer = PaUtil_SelectZeroer( hostOutputSampleFormat );

        bp->userOutputIsInterleaved = (userOutputSampleFormat & paNonInterleaved)?0:1;

        bp->hostOutputIsInterleaved = (hostOutputSampleFormat & paNonInterleaved)?0:1;

        bp->userOutputSampleFormatIsEqualToHost = ((userOutputSampleFormat & ~paNonInterleaved) == (hostOutputSampleFormat & ~paNonInterleaved));

        tempOutputBufferSize =
                bp->framesPerTempBuffer * bp->bytesPerUserOutputSample * outputChannelCount;

        bp->tempOutputBuffer = PaUtil_AllocateMemory( tempOutputBufferSize );
        if( bp->tempOutputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        if( bp->framesInTempOutputBuffer > 0 )
            memset( bp->tempOutputBuffer, 0, tempOutputBufferSize );
        
        if( userOutputSampleFormat & paNonInterleaved )
        {
            bp->tempOutputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*outputChannelCount );
            if( bp->tempOutputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostOutputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor)*outputChannelCount * 2 );
        if( bp->hostOutputChannels[0] == 0 )
        {                                                                     
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostOutputChannels[1] = &bp->hostOutputChannels[0][outputChannelCount];
    }

    PaUtil_InitializeTriangularDitherState( &bp->ditherGenerator );

    bp->samplePeriod = 1. / sampleRate;

    bp->streamCallback = streamCallback;
    bp->userData = userData;

    return result;

error:
    if( bp->tempInputBuffer )
        PaUtil_FreeMemory( bp->tempInputBuffer );

    if( bp->tempInputBufferPtrs )
        PaUtil_FreeMemory( bp->tempInputBufferPtrs );

    if( bp->hostInputChannels[0] )
        PaUtil_FreeMemory( bp->hostInputChannels[0] );

    if( bp->tempOutputBuffer )
        PaUtil_FreeMemory( bp->tempOutputBuffer );

    if( bp->tempOutputBufferPtrs )
        PaUtil_FreeMemory( bp->tempOutputBufferPtrs );

    if( bp->hostOutputChannels[0] )
        PaUtil_FreeMemory( bp->hostOutputChannels[0] );

    return result;
}